

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O3

Char * __thiscall
fmt::BasicFormatter<char,_fmt::ArgFormatter<char>_>::format
          (BasicFormatter<char,_fmt::ArgFormatter<char>_> *this,Char **format_str,Arg *arg)

{
  byte bVar1;
  byte bVar2;
  bool bVar3;
  runtime_error *prVar4;
  char *pcVar5;
  FormatError *this_00;
  char cVar6;
  char *pcVar7;
  undefined4 uVar8;
  int iVar9;
  undefined4 uVar10;
  Char *s;
  string message;
  char local_71;
  char *local_70;
  anon_union_16_12_986ea841_for_Value_0 local_68;
  BasicFormatter<char,_fmt::ArgFormatter<char>_> *local_58;
  char *local_50;
  uint local_48;
  int iStack_44;
  undefined4 uStack_40;
  undefined4 uStack_3c;
  uint local_38;
  char local_34;
  
  pcVar7 = *format_str;
  local_48 = 0;
  iStack_44 = 0x20;
  uStack_40 = 0;
  uStack_3c = 0;
  local_38 = 0xffffffff;
  local_34 = '\0';
  local_70 = pcVar7;
  if (*pcVar7 == ':') {
    if (arg->type == CUSTOM) {
      (*(arg->super_Value).field_0.custom.format)
                (this,(void *)(arg->super_Value).field_0.long_long_value,&local_70);
      return local_70;
    }
    local_70 = pcVar7 + 1;
    bVar1 = pcVar7[1];
    iVar9 = (int)(char)bVar1;
    if (iVar9 == 0) goto LAB_0010aeb6;
    bVar2 = pcVar7[2];
    if (bVar2 < 0x3e) {
      if (bVar2 == 0x3c) {
        uStack_40 = 1;
        goto LAB_0010aad0;
      }
      if (bVar2 == 0x3d) {
        bVar3 = true;
        uStack_40 = 4;
        goto LAB_0010aad2;
      }
LAB_0010aa8d:
      pcVar7 = pcVar7 + 2;
      if (bVar1 < 0x3e) {
        if (bVar1 == 0x3c) {
          uStack_40 = 1;
          local_70 = pcVar7;
          goto LAB_0010ab8e;
        }
        if (bVar1 != 0x3d) goto LAB_0010ab8e;
        uStack_40 = 4;
LAB_0010ab07:
        local_71 = '=';
        local_70 = pcVar7;
        if (9 < (int)arg->type) {
          format<char>((string *)&local_68.string,(CStringRef)0x11c898,&local_71);
          prVar4 = (runtime_error *)__cxa_allocate_exception(0x10);
          std::runtime_error::runtime_error(prVar4,local_68.string.value);
          *(undefined ***)prVar4 = &PTR__runtime_error_00126c28;
          __cxa_throw(prVar4,&FormatError::typeinfo,std::runtime_error::~runtime_error);
        }
      }
      else if (bVar1 == 0x3e) {
        uStack_40 = 2;
        local_70 = pcVar7;
      }
      else if (bVar1 == 0x5e) {
        uStack_40 = 3;
        local_70 = pcVar7;
      }
    }
    else {
      if (bVar2 == 0x5e) {
        uStack_40 = 3;
      }
      else {
        if (bVar2 != 0x3e) goto LAB_0010aa8d;
        uStack_40 = 2;
      }
LAB_0010aad0:
      bVar3 = false;
LAB_0010aad2:
      if (bVar1 != 0x7d) {
        if (bVar1 == 0x7b) {
          this_00 = (FormatError *)__cxa_allocate_exception(0x10);
          FormatError::FormatError(this_00,(CStringRef)0x11c7bf);
          goto LAB_0010af17;
        }
        pcVar7 = pcVar7 + 3;
        local_70 = pcVar7;
        iStack_44 = iVar9;
        if (bVar3) goto LAB_0010ab07;
      }
    }
LAB_0010ab8e:
    cVar6 = *local_70;
    if (cVar6 == ' ') {
      uVar8 = 9;
      uVar10 = 1;
LAB_0010abc5:
      internal::check_sign<char>(&local_70,arg);
      cVar6 = *local_70;
      uStack_3c = uVar10;
    }
    else {
      if (cVar6 == '+') {
        uVar8 = 0xb;
        uVar10 = 3;
        goto LAB_0010abc5;
      }
      if (cVar6 == '-') {
        uVar8 = 0xc;
        uVar10 = 4;
        goto LAB_0010abc5;
      }
      uVar8 = 8;
    }
    if (cVar6 == '#') {
      local_71 = '#';
      if (9 < (int)arg->type) {
        format<char>((string *)&local_68.string,(CStringRef)0x11c898,&local_71);
        prVar4 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error(prVar4,local_68.string.value);
        *(undefined ***)prVar4 = &PTR__runtime_error_00126c28;
        __cxa_throw(prVar4,&FormatError::typeinfo,std::runtime_error::~runtime_error);
      }
      cVar6 = local_70[1];
      local_70 = local_70 + 1;
      uStack_3c = uVar8;
    }
    if (cVar6 == '0') {
      local_71 = '0';
      if (9 < (int)arg->type) {
        format<char>((string *)&local_68.string,(CStringRef)0x11c898,&local_71);
        prVar4 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error(prVar4,local_68.string.value);
        *(undefined ***)prVar4 = &PTR__runtime_error_00126c28;
        __cxa_throw(prVar4,&FormatError::typeinfo,std::runtime_error::~runtime_error);
      }
      iStack_44 = 0x30;
      uStack_40 = 4;
      cVar6 = local_70[1];
      local_70 = local_70 + 1;
    }
    if ((byte)(cVar6 - 0x30U) < 10) {
      local_48 = internal::parse_nonnegative_int<char>(&local_70);
    }
    else {
      if (cVar6 != '{') goto LAB_0010ad50;
      if ((local_70[1] == 0x5f) || ((byte)((local_70[1] & 0xdfU) + 0xbf) < 0x1a)) {
        local_70 = local_70 + 1;
        parse_arg_name((Arg *)&local_68.string,this,&local_70);
      }
      else {
        local_70 = local_70 + 1;
        parse_arg_index((Arg *)&local_68.string,this,&local_70);
      }
      pcVar7 = local_70 + 1;
      if (*local_70 != '}') {
        local_70 = pcVar7;
        this_00 = (FormatError *)__cxa_allocate_exception(0x10);
        FormatError::FormatError(this_00,(CStringRef)0x11c68f);
        goto LAB_0010af17;
      }
      pcVar5 = local_68.string.value;
      switch(local_58._0_4_) {
      case 2:
        pcVar5 = (char *)(long)local_68.int_value;
        if ((long)pcVar5 < 0) {
          local_70 = pcVar7;
          this_00 = (FormatError *)__cxa_allocate_exception(0x10);
          FormatError::FormatError(this_00,(CStringRef)0x11c7da);
          goto LAB_0010af17;
        }
        goto LAB_0010ad4c;
      case 3:
        pcVar5 = (char *)(local_68.ulong_long_value & 0xffffffff);
        break;
      case 4:
        if (local_68.long_long_value < 0) {
          local_70 = pcVar7;
          this_00 = (FormatError *)__cxa_allocate_exception(0x10);
          FormatError::FormatError(this_00,(CStringRef)0x11c7da);
          goto LAB_0010af17;
        }
        break;
      case 5:
        break;
      default:
        local_70 = pcVar7;
        this_00 = (FormatError *)__cxa_allocate_exception(0x10);
        FormatError::FormatError(this_00,(CStringRef)0x11c7e9);
        goto LAB_0010af17;
      }
      if ((ulong)pcVar5 >> 0x1f != 0) {
        local_70 = pcVar7;
        this_00 = (FormatError *)__cxa_allocate_exception(0x10);
        FormatError::FormatError(this_00,(CStringRef)0x11c7ad);
        goto LAB_0010af17;
      }
LAB_0010ad4c:
      local_48 = (uint)pcVar5;
      local_70 = pcVar7;
    }
LAB_0010ad50:
    cVar6 = *local_70;
    if (cVar6 == '.') {
      local_38 = 0;
      if ((byte)(local_70[1] - 0x30U) < 10) {
        local_70 = local_70 + 1;
        local_38 = internal::parse_nonnegative_int<char>(&local_70);
      }
      else {
        if (local_70[1] != '{') {
          local_70 = local_70 + 1;
          this_00 = (FormatError *)__cxa_allocate_exception(0x10);
          FormatError::FormatError(this_00,(CStringRef)0x11c82a);
          goto LAB_0010af17;
        }
        if ((local_70[2] == 0x5f) || ((byte)((local_70[2] & 0xdfU) + 0xbf) < 0x1a)) {
          local_70 = local_70 + 2;
          parse_arg_name((Arg *)&local_68.string,this,&local_70);
        }
        else {
          local_70 = local_70 + 2;
          parse_arg_index((Arg *)&local_68.string,this,&local_70);
        }
        pcVar7 = local_70 + 1;
        if (*local_70 != '}') {
          local_70 = pcVar7;
          this_00 = (FormatError *)__cxa_allocate_exception(0x10);
          FormatError::FormatError(this_00,(CStringRef)0x11c68f);
          goto LAB_0010af17;
        }
        pcVar5 = (char *)local_68.long_long_value;
        switch(local_58._0_4_) {
        case 2:
          pcVar5 = (char *)(long)local_68.int_value;
          if ((long)pcVar5 < 0) {
            local_70 = pcVar7;
            this_00 = (FormatError *)__cxa_allocate_exception(0x10);
            FormatError::FormatError(this_00,(CStringRef)0x11c7fe);
            goto LAB_0010af17;
          }
          goto LAB_0010ae76;
        case 3:
          pcVar5 = (char *)(local_68.ulong_long_value & 0xffffffff);
          break;
        case 4:
          if (local_68.long_long_value < 0) {
            local_70 = pcVar7;
            this_00 = (FormatError *)__cxa_allocate_exception(0x10);
            FormatError::FormatError(this_00,(CStringRef)0x11c7fe);
            goto LAB_0010af17;
          }
          break;
        case 5:
          break;
        default:
          local_70 = pcVar7;
          this_00 = (FormatError *)__cxa_allocate_exception(0x10);
          FormatError::FormatError(this_00,(CStringRef)0x11c811);
          goto LAB_0010af17;
        }
        if ((ulong)pcVar5 >> 0x1f != 0) {
          local_70 = pcVar7;
          this_00 = (FormatError *)__cxa_allocate_exception(0x10);
          FormatError::FormatError(this_00,(CStringRef)0x11c7ad);
          goto LAB_0010af17;
        }
LAB_0010ae76:
        local_38 = (uint)pcVar5;
        local_70 = pcVar7;
      }
      if (((int)arg->type < 8) || (arg->type == POINTER)) {
        prVar4 = (runtime_error *)__cxa_allocate_exception(0x10);
        pcVar7 = "integer";
        if (arg->type == POINTER) {
          pcVar7 = "pointer";
        }
        format<char[8]>((string *)&local_68.string,(CStringRef)0x11c846,(char (*) [8])pcVar7);
        std::runtime_error::runtime_error(prVar4,local_68.string.value);
        *(undefined ***)prVar4 = &PTR__runtime_error_00126c28;
        __cxa_throw(prVar4,&FormatError::typeinfo,std::runtime_error::~runtime_error);
      }
      cVar6 = *local_70;
    }
    if ((cVar6 != '\0') && (cVar6 != '}')) {
      local_34 = *local_70;
      local_70 = local_70 + 1;
    }
  }
LAB_0010aeb6:
  if (*local_70 == '}') {
    local_68.long_long_value = (LongLong)this->writer_;
    local_68.custom.format = (FormatFunc)&local_48;
    local_50 = local_70;
    local_70 = local_70 + 1;
    local_58 = this;
    ArgVisitor<fmt::ArgFormatter<char>,_void>::visit
              ((ArgVisitor<fmt::ArgFormatter<char>,_void> *)&local_68.string,arg);
    return local_70;
  }
  local_70 = local_70 + 1;
  this_00 = (FormatError *)__cxa_allocate_exception(0x10);
  FormatError::FormatError(this_00,(CStringRef)0x11c87b);
LAB_0010af17:
  __cxa_throw(this_00,&FormatError::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

const Char *BasicFormatter<Char, ArgFormatter>::format(const Char *&format_str, const internal::Arg &arg)
{
    using internal::Arg;
    const Char *s = format_str;
    typename ArgFormatter::SpecType spec;
    if (*s == ':')
    {
        if (arg.type == Arg::CUSTOM)
        {
            arg.custom.format(this, arg.custom.value, &s);
            return s;
        }
        ++s;
        // Parse fill and alignment.
        if (Char c = *s)
        {
            const Char *p = s + 1;
            spec.align_ = ALIGN_DEFAULT;
            do
            {
                switch (*p)
                {
                case '<':
                    spec.align_ = ALIGN_LEFT;
                    break;
                case '>':
                    spec.align_ = ALIGN_RIGHT;
                    break;
                case '=':
                    spec.align_ = ALIGN_NUMERIC;
                    break;
                case '^':
                    spec.align_ = ALIGN_CENTER;
                    break;
                }
                if (spec.align_ != ALIGN_DEFAULT)
                {
                    if (p != s)
                    {
                        if (c == '}')
                            break;
                        if (c == '{')
                            FMT_THROW(FormatError("invalid fill character '{'"));
                        s += 2;
                        spec.fill_ = c;
                    }
                    else
                        ++s;
                    if (spec.align_ == ALIGN_NUMERIC)
                        require_numeric_argument(arg, '=');
                    break;
                }
            } while (--p >= s);
        }

        // Parse sign.
        switch (*s)
        {
        case '+':
            check_sign(s, arg);
            spec.flags_ |= SIGN_FLAG | PLUS_FLAG;
            break;
        case '-':
            check_sign(s, arg);
            spec.flags_ |= MINUS_FLAG;
            break;
        case ' ':
            check_sign(s, arg);
            spec.flags_ |= SIGN_FLAG;
            break;
        }

        if (*s == '#')
        {
            require_numeric_argument(arg, '#');
            spec.flags_ |= HASH_FLAG;
            ++s;
        }

        // Parse zero flag.
        if (*s == '0')
        {
            require_numeric_argument(arg, '0');
            spec.align_ = ALIGN_NUMERIC;
            spec.fill_ = '0';
            ++s;
        }

        // Parse width.
        if ('0' <= *s && *s <= '9')
        {
            spec.width_ = internal::parse_nonnegative_int(s);
        }
        else if (*s == '{')
        {
            ++s;
            Arg width_arg = internal::is_name_start(*s) ? parse_arg_name(s) : parse_arg_index(s);
            if (*s++ != '}')
                FMT_THROW(FormatError("invalid format string"));
            ULongLong value = 0;
            switch (width_arg.type)
            {
            case Arg::INT:
                if (width_arg.int_value < 0)
                    FMT_THROW(FormatError("negative width"));
                value = width_arg.int_value;
                break;
            case Arg::UINT:
                value = width_arg.uint_value;
                break;
            case Arg::LONG_LONG:
                if (width_arg.long_long_value < 0)
                    FMT_THROW(FormatError("negative width"));
                value = width_arg.long_long_value;
                break;
            case Arg::ULONG_LONG:
                value = width_arg.ulong_long_value;
                break;
            default:
                FMT_THROW(FormatError("width is not integer"));
            }
            unsigned max_int = (std::numeric_limits<int>::max)();
            if (value > max_int)
                FMT_THROW(FormatError("number is too big"));
            spec.width_ = static_cast<int>(value);
        }

        // Parse precision.
        if (*s == '.')
        {
            ++s;
            spec.precision_ = 0;
            if ('0' <= *s && *s <= '9')
            {
                spec.precision_ = internal::parse_nonnegative_int(s);
            }
            else if (*s == '{')
            {
                ++s;
                Arg precision_arg = internal::is_name_start(*s) ? parse_arg_name(s) : parse_arg_index(s);
                if (*s++ != '}')
                    FMT_THROW(FormatError("invalid format string"));
                ULongLong value = 0;
                switch (precision_arg.type)
                {
                case Arg::INT:
                    if (precision_arg.int_value < 0)
                        FMT_THROW(FormatError("negative precision"));
                    value = precision_arg.int_value;
                    break;
                case Arg::UINT:
                    value = precision_arg.uint_value;
                    break;
                case Arg::LONG_LONG:
                    if (precision_arg.long_long_value < 0)
                        FMT_THROW(FormatError("negative precision"));
                    value = precision_arg.long_long_value;
                    break;
                case Arg::ULONG_LONG:
                    value = precision_arg.ulong_long_value;
                    break;
                default:
                    FMT_THROW(FormatError("precision is not integer"));
                }
                unsigned max_int = (std::numeric_limits<int>::max)();
                if (value > max_int)
                    FMT_THROW(FormatError("number is too big"));
                spec.precision_ = static_cast<int>(value);
            }
            else
            {
                FMT_THROW(FormatError("missing precision specifier"));
            }
            if (arg.type <= Arg::LAST_INTEGER_TYPE || arg.type == Arg::POINTER)
            {
                FMT_THROW(FormatError(
                    fmt::format("precision not allowed in {} format specifier", arg.type == Arg::POINTER ? "pointer" : "integer")));
            }
        }

        // Parse type.
        if (*s != '}' && *s)
            spec.type_ = static_cast<char>(*s++);
    }

    if (*s++ != '}')
        FMT_THROW(FormatError("missing '}' in format string"));

    // Format argument.
    ArgFormatter(*this, spec, s - 1).visit(arg);
    return s;
}